

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

DynamicStackArray<embree::Vec3fa,_32UL,_128UL> * __thiscall
embree::DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=
          (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *this,
          DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar4;
  ulong uVar5;
  ulong uVar6;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar7;
  long lVar8;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *local_38;
  
  pDVar7 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)other->data;
  lVar8 = 0;
  uVar6 = 0;
  do {
    pDVar4 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)this->data;
    if ((0x1f < uVar6) && (pDVar4 == this)) {
      DynamicStackArray<embree::Vec3fa,32ul,128ul>::operator=
                ((DynamicStackArray<embree::Vec3fa,32ul,128ul> *)&this->data);
      pDVar4 = local_38;
    }
    uVar6 = uVar6 + 1;
    puVar2 = (undefined8 *)((long)&pDVar7->arr[0].field_0 + lVar8);
    uVar3 = puVar2[1];
    puVar1 = (undefined8 *)((long)&pDVar4->arr[0].field_0 + lVar8);
    *puVar1 = *puVar2;
    puVar1[1] = uVar3;
    pDVar7 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)other->data;
    uVar5 = 0x80;
    if (pDVar7 == other) {
      uVar5 = 0x20;
    }
    lVar8 = lVar8 + 0x10;
  } while (uVar6 < uVar5);
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }